

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

bool __thiscall slang::SVInt::isSignExtendedFrom(SVInt *this,bitwidth_t msb)

{
  bool bVar1;
  uint64_t *input;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  ulong topWordMask;
  
  uVar4 = (this->super_SVIntStorage).bitWidth;
  bVar2 = true;
  if (msb < uVar4 - 1) {
    topWordMask = -(ulong)((uVar4 & 0x3f) == 0) | ~(-1L << (sbyte)(uVar4 & 0x3f));
    bVar1 = (this->super_SVIntStorage).unknownFlag;
    if (uVar4 < 0x41 && (bVar1 & 1U) == 0) {
      uVar3 = (this->super_SVIntStorage).field_0.val >> ((byte)msb & 0x3f);
      bVar2 = uVar3 == topWordMask >> ((byte)msb & 0x3f) || uVar3 == 0;
    }
    else {
      uVar4 = uVar4 + 0x3f >> 6;
      input = (this->super_SVIntStorage).field_0.pVal;
      bVar2 = isSignExtended(input,uVar4,msb >> 6,msb & 0x3f,topWordMask);
      if ((bVar1 & bVar2) == 1) {
        bVar2 = isSignExtended(input + uVar4,uVar4,msb >> 6,msb & 0x3f,topWordMask);
        return bVar2;
      }
    }
  }
  return bVar2;
}

Assistant:

bool SVInt::isSignExtendedFrom(bitwidth_t msb) const {
    if (msb >= bitWidth - 1)
        return true;

    uint64_t maskMsw;
    bitwidth_t bitsInMsw;
    getTopWordMask(bitsInMsw, maskMsw);

    if (isSingleWord()) {
        auto signBits = val >> msb;
        return !signBits || signBits == maskMsw >> msb;
    }

    auto bit = whichBit(msb);
    auto word = whichWord(msb);
    auto numWords = getNumWords(bitWidth, false);

    if (!isSignExtended(pVal, numWords, word, bit, maskMsw))
        return false;

    if (!unknownFlag)
        return true;

    return isSignExtended(pVal + numWords, numWords, word, bit, maskMsw);
}